

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readdata.cpp
# Opt level: O0

bool CRCCheck(uchar *Head,uchar *Message,int MessageLength,int pos)

{
  uchar *ucBuffer;
  unsigned_long uVar1;
  unsigned_long uVar2;
  ulong uVar3;
  unsigned_long CRC;
  unsigned_long CRC_Calcu;
  int i;
  uchar *CRCtest;
  int pos_local;
  int MessageLength_local;
  uchar *Message_local;
  uchar *Head_local;
  
  uVar3 = (ulong)(MessageLength + 0x1c);
  if ((long)uVar3 < 0) {
    uVar3 = 0xffffffffffffffff;
  }
  ucBuffer = (uchar *)operator_new__(uVar3);
  *ucBuffer = 0xaa;
  ucBuffer[1] = 'D';
  ucBuffer[2] = '\x12';
  for (CRC_Calcu._4_4_ = 0; CRC_Calcu._4_4_ < MessageLength + 0x19;
      CRC_Calcu._4_4_ = CRC_Calcu._4_4_ + 1) {
    if (CRC_Calcu._4_4_ < 0x19) {
      ucBuffer[CRC_Calcu._4_4_ + 3] = Head[CRC_Calcu._4_4_];
    }
    else {
      ucBuffer[CRC_Calcu._4_4_ + 3] = Message[CRC_Calcu._4_4_ + -0x19];
    }
  }
  uVar1 = CalculateBlockCRC32((long)(MessageLength + 0x1c),ucBuffer);
  uVar2 = U2L(Message + pos,4);
  if (ucBuffer != (uchar *)0x0) {
    operator_delete__(ucBuffer);
  }
  return uVar2 == uVar1;
}

Assistant:

bool CRCCheck(unsigned char* Head, unsigned char* Message, int MessageLength, int pos)
{
    unsigned char* CRCtest = new unsigned char[MessageLength + 28];
    CRCtest[0] = 0xAA;
    CRCtest[1] = 0x44;
    CRCtest[2] = 0x12;
    for(int i = 0; i < MessageLength + 25; ++i)
    {
        if(i < 25)
            CRCtest[i + 3] = Head[i];
        else
            CRCtest[i + 3] = Message[i - 25];
    }
    unsigned long CRC_Calcu = CalculateBlockCRC32(MessageLength + 28, CRCtest);
    unsigned long CRC = U2L((Message) + pos, 4);
    delete [] CRCtest;

    if(CRC == CRC_Calcu)
        return true;
    else
        return false;
}